

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void ws_send_control(nni_ws *ws,uint8_t op,uint8_t *buf,size_t len)

{
  int iVar1;
  ws_frame *local_30;
  ws_frame *frame;
  size_t len_local;
  uint8_t *buf_local;
  nni_ws *pnStack_10;
  uint8_t op_local;
  nni_ws *ws_local;
  
  if (((ws->closed & 1U) == 0) &&
     (frame = (ws_frame *)len, len_local = (size_t)buf, buf_local._7_1_ = op, pnStack_10 = ws,
     iVar1 = ws_msg_init_control(&local_30,ws,op,buf,len), iVar1 == 0)) {
    nni_list_prepend(&pnStack_10->txq,local_30);
    ws_start_write(pnStack_10);
  }
  return;
}

Assistant:

static void
ws_send_control(nni_ws *ws, uint8_t op, uint8_t *buf, size_t len)
{
	ws_frame *frame;

	// Note that we do not care if this works or not.  So no AIO needed.

	if ((ws->closed) ||
	    (ws_msg_init_control(&frame, ws, op, buf, len) != 0)) {
		return;
	}

	// Control frames at head of list.  (Note that this may preempt
	// the close frame or other ping/pong requests.  Oh well.)
	nni_list_prepend(&ws->txq, frame);
	ws_start_write(ws);
}